

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

void __thiscall PosixLockedPageAllocator::PosixLockedPageAllocator(PosixLockedPageAllocator *this)

{
  long lVar1;
  _func_int **pp_Var2;
  LockedPageAllocator *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LockedPageAllocator::LockedPageAllocator(in_RDI);
  in_RDI->_vptr_LockedPageAllocator = (_func_int **)&PTR__PosixLockedPageAllocator_0161aad8;
  pp_Var2 = (_func_int **)sysconf(0x1e);
  in_RDI[1]._vptr_LockedPageAllocator = pp_Var2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PosixLockedPageAllocator::PosixLockedPageAllocator()
{
    // Determine system page size in bytes
#if defined(PAGESIZE) // defined in limits.h
    page_size = PAGESIZE;
#else                   // assume some POSIX OS
    page_size = sysconf(_SC_PAGESIZE);
#endif
}